

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVerify.cpp
# Opt level: O0

void SubVerifyBase<signed_char,unsigned_char>(char *types)

{
  bool bVar1;
  TestCase<signed_char,_unsigned_char,_4> TVar2;
  char *pcVar3;
  string msg_2;
  char x;
  string msg_1;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  string msg;
  char ret;
  TestCase<signed_char,_unsigned_char,_4> test;
  TestVector<signed_char,_unsigned_char,_4> tests;
  undefined7 in_stack_fffffffffffffdd8;
  uchar in_stack_fffffffffffffddf;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffde0;
  TestVector<signed_char,_unsigned_char,_4> *in_stack_fffffffffffffde8;
  allocator *in_stack_fffffffffffffdf0;
  undefined1 local_1c1 [30];
  undefined1 in_stack_fffffffffffffe5d;
  uchar in_stack_fffffffffffffe5e;
  char in_stack_fffffffffffffe5f;
  string *in_stack_fffffffffffffe60;
  string local_198 [32];
  string local_178 [32];
  string local_158 [37];
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_133;
  char local_132;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [37];
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_a3;
  byte local_a2;
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  string local_48 [37];
  undefined2 local_23;
  byte local_21;
  TestVector<signed_char,_unsigned_char,_4> local_20;
  
  TestVector<signed_char,_unsigned_char,_4>::TestVector(&local_20);
  TVar2 = TestVector<signed_char,_unsigned_char,_4>::GetNext(in_stack_fffffffffffffde8);
  local_23 = TVar2._0_2_;
  local_21 = TVar2.fExpected;
  while( true ) {
    bVar1 = TestVector<signed_char,_unsigned_char,_4>::Done(&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeSubtract<signed_char,unsigned_char>
                      ((char)((ulong)in_stack_fffffffffffffde0 >> 0x38),
                       (uchar)((ulong)in_stack_fffffffffffffde0 >> 0x30),
                       (char *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
    if (bVar1 != (bool)(local_21 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"Error in case ",&local_69);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffde8,&in_stack_fffffffffffffde0->m_int);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,pcVar3,&local_a1);
      err_msg<signed_char,unsigned_char>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5f,in_stack_fffffffffffffe5e,
                 (bool)in_stack_fffffffffffffe5d);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      std::__cxx11::string::~string(local_48);
    }
    local_a2 = 1;
    SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_a3,(char *)&local_23);
    SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator-=(in_stack_fffffffffffffde0,in_stack_fffffffffffffddf);
    if ((local_a2 & 1) != (local_21 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"Error in case ",&local_109);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffde8,&in_stack_fffffffffffffde0->m_int);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffde8,&in_stack_fffffffffffffde0->m_int);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,pcVar3,&local_131);
      err_msg<signed_char,unsigned_char>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5f,in_stack_fffffffffffffe5e,
                 (bool)in_stack_fffffffffffffe5d);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      std::__cxx11::string::~string(local_c8);
    }
    local_a2 = 1;
    local_132 = (char)local_23;
    SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_133,(uchar *)((long)&local_23 + 1));
    operator-=((char *)in_stack_fffffffffffffde8,
               (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                )(uchar)((ulong)in_stack_fffffffffffffdf0 >> 0x38));
    if ((local_a2 & 1) != (local_21 & 1)) {
      in_stack_fffffffffffffdf0 = (allocator *)&stack0xfffffffffffffe67;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_198,"Error in case ",in_stack_fffffffffffffdf0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffde8,&in_stack_fffffffffffffde0->m_int);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffde8,&in_stack_fffffffffffffde0->m_int);
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe67);
      in_stack_fffffffffffffde0 =
           (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffde8 = (TestVector<signed_char,_unsigned_char,_4> *)local_1c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1c1 + 1),&in_stack_fffffffffffffde0->m_int,
                 (allocator *)in_stack_fffffffffffffde8);
      err_msg<signed_char,unsigned_char>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5f,in_stack_fffffffffffffe5e,
                 (bool)in_stack_fffffffffffffe5d);
      std::__cxx11::string::~string((string *)(local_1c1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1c1);
      std::__cxx11::string::~string(local_158);
    }
    TVar2 = TestVector<signed_char,_unsigned_char,_4>::GetNext(in_stack_fffffffffffffde8);
    local_23 = TVar2._0_2_;
    local_21 = TVar2.fExpected;
  }
  return;
}

Assistant:

void SubVerifyBase(const char* types)
{
    TestVector< T, U, OpType::Sub > tests;
    TestCase< T, U, OpType::Sub > test = tests.GetNext();

    while (!tests.Done())
    {
        T ret;
        if (SafeSubtract(test.x, test.y, ret) != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types;
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Now test throwing version
        bool fSuccess = true;
        try
        {
            SafeInt<T> si(test.x);
            si -= test.y;
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (1): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Also need to test the version that assigns back out
        // to a plain int, as it has different logic
        fSuccess = true;
        try
        {
            T x(test.x);
            x -= SafeInt<U>(test.y);
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (2): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        test = tests.GetNext();
    }
}